

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O1

void __thiscall QDateTimeEdit::paintEvent(QDateTimeEdit *this,QPaintEvent *event)

{
  long lVar1;
  long in_FS_OFFSET;
  QStyleOptionSpinBox opt;
  undefined1 *local_138;
  QDateTimeEdit *pQStack_130;
  QStyle *local_128;
  undefined1 local_118 [72];
  bool local_d0;
  bool local_bc;
  QArrayData *local_b8;
  QIcon local_a0 [3];
  undefined1 local_88 [16];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QPalettePrivate *pQStack_60;
  undefined1 *local_58;
  QObject *pQStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  if ((*(char *)(lVar1 + 0x4fa) == '\x01') && ((*(uint *)(lVar1 + 0x470) & 0x3f00) != 0)) {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_50 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_60 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionSpinBox::QStyleOptionSpinBox((QStyleOptionSpinBox *)local_88);
    (**(code **)(*(long *)&(this->super_QAbstractSpinBox).super_QWidget + 0x1c0))
              (this,(QStyleOptionSpinBox *)local_88);
    memset((QStyleOptionComboBox *)local_118,0xaa,0x90);
    QStyleOptionComboBox::QStyleOptionComboBox((QStyleOptionComboBox *)local_118);
    QStyleOption::initFrom((QStyleOption *)local_118,(QWidget *)this);
    local_d0 = true;
    local_bc = local_38._0_1_;
    local_118._64_8_ = local_48;
    local_118._8_4_ = local_88._8_4_;
    if ((*(byte *)(lVar1 + 0x3d0) & 2) != 0) {
      local_118._8_4_ = local_88._8_4_ & 0xfffffffe;
    }
    local_128 = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
    local_138 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_130 = (QDateTimeEdit *)&DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter((QPainter *)&local_138);
    pQStack_130 = this;
    local_128 = QWidget::style((QWidget *)this);
    QPainter::begin((QPaintDevice *)&local_138);
    QPainter::setRenderHint((RenderHint)&local_138,true);
    (**(code **)(*(long *)local_128 + 200))(local_128,1,local_118,&local_138,pQStack_130);
    QPainter::~QPainter((QPainter *)&local_138);
    QIcon::~QIcon((QIcon *)(local_118 + 0x78));
    if (local_b8 != (QArrayData *)0x0) {
      LOCK();
      (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_b8,2,0x10);
      }
    }
    QStyleOption::~QStyleOption((QStyleOption *)local_118);
    QStyleOption::~QStyleOption((QStyleOption *)local_88);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    QAbstractSpinBox::paintEvent((QAbstractSpinBox *)this,event);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::paintEvent(QPaintEvent *event)
{
    Q_D(QDateTimeEdit);
    if (!d->calendarPopupEnabled()) {
        QAbstractSpinBox::paintEvent(event);
        return;
    }

    QStyleOptionSpinBox opt;
    initStyleOption(&opt);

    QStyleOptionComboBox optCombo;

    optCombo.initFrom(this);
    optCombo.editable = true;
    optCombo.frame = opt.frame;
    optCombo.subControls = opt.subControls;
    optCombo.activeSubControls = opt.activeSubControls;
    optCombo.state = opt.state;
    if (d->readOnly) {
        optCombo.state &= ~QStyle::State_Enabled;
    }

    QStylePainter p(this);
    p.drawComplexControl(QStyle::CC_ComboBox, optCombo);
}